

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl,UA_Job **jobs)

{
  void *pvVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  UA_Job *pUVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  
  pvVar1 = nl->handle;
  sVar8 = 0;
  UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
              "Shutting down the TCP network layer with %d open connection(s)",
              *(undefined8 *)((long)pvVar1 + 0x28));
  shutdown(*(int *)((long)pvVar1 + 0x20),2);
  close(*(int *)((long)pvVar1 + 0x20));
  lVar5 = *(long *)((long)pvVar1 + 0x28);
  pUVar4 = (UA_Job *)malloc(lVar5 << 6);
  if (pUVar4 != (UA_Job *)0x0) {
    if (lVar5 == 0) {
      sVar8 = 0;
    }
    else {
      lVar5 = *(long *)((long)pvVar1 + 0x30);
      lVar7 = 0;
      uVar6 = 0;
      do {
        puVar2 = *(undefined4 **)(lVar5 + lVar7);
        *puVar2 = 2;
        shutdown(puVar2[0xe],2);
        close(puVar2[0xe]);
        (&pUVar4->type)[lVar7] = UA_JOBTYPE_DETACHCONNECTION;
        lVar5 = *(long *)((long)pvVar1 + 0x30);
        uVar3 = *(undefined8 *)(lVar5 + lVar7);
        *(undefined8 *)((long)&pUVar4->job + lVar7 * 4) = uVar3;
        (&pUVar4[1].type)[lVar7] = UA_JOBTYPE_METHODCALL_DELAYED;
        *(code **)((long)&pUVar4[1].job + lVar7 * 4 + 8) = FreeConnectionCallback;
        *(undefined8 *)((long)&pUVar4[1].job + lVar7 * 4) = uVar3;
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 < *(ulong *)((long)pvVar1 + 0x28));
      sVar8 = *(ulong *)((long)pvVar1 + 0x28) * 2;
    }
    *jobs = pUVar4;
  }
  return sVar8;
}

Assistant:

static size_t
ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl, UA_Job **jobs) {
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "Shutting down the TCP network layer with %d open connection(s)",
                layer->mappingsSize);
    shutdown((SOCKET)layer->serversockfd,2);
    CLOSESOCKET(layer->serversockfd);
    UA_Job *items = malloc(sizeof(UA_Job) * layer->mappingsSize * 2);
    if(!items)
        return 0;
    for(size_t i = 0; i < layer->mappingsSize; ++i) {
        socket_close(layer->mappings[i].connection);
        items[i*2].type = UA_JOBTYPE_DETACHCONNECTION;
        items[i*2].job.closeConnection = layer->mappings[i].connection;
        items[(i*2)+1].type = UA_JOBTYPE_METHODCALL_DELAYED;
        items[(i*2)+1].job.methodCall.method = FreeConnectionCallback;
        items[(i*2)+1].job.methodCall.data = layer->mappings[i].connection;
    }
#ifdef _WIN32
    WSACleanup();
#endif
    *jobs = items;
    return layer->mappingsSize*2;
}